

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpsocketengine.cpp
# Opt level: O0

void __thiscall QHttpSocketEngine::emitConnectionNotification(QHttpSocketEngine *this)

{
  QHttpSocketEnginePrivate *pQVar1;
  undefined8 in_RDI;
  ConnectionType c;
  char *unaff_retaddr;
  QHttpSocketEnginePrivate *d;
  
  c = (ConnectionType)((ulong)in_RDI >> 0x20);
  pQVar1 = d_func((QHttpSocketEngine *)0x33b53b);
  if ((pQVar1->connectionNotificationPending & 1U) == 0) {
    pQVar1->connectionNotificationPending = true;
    QMetaObject::invokeMethod<>((QObject *)d,unaff_retaddr,c);
  }
  return;
}

Assistant:

void QHttpSocketEngine::emitConnectionNotification()
{
    Q_D(QHttpSocketEngine);
    if (!d->connectionNotificationPending) {
        d->connectionNotificationPending = true;
        QMetaObject::invokeMethod(this, "emitPendingConnectionNotification", Qt::QueuedConnection);
    }
}